

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
          (QSharedDataPointer<QStyleSheetOutlineData> *this)

{
  QStyleSheetOutlineData *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
    LOCK();
    (pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
        QStyleSheetBorderData::~QStyleSheetBorderData(&pQVar1->super_QStyleSheetBorderData);
      }
      operator_delete(pQVar1,0x80);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }